

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

OP1aHeader * __thiscall
ASDCP::MXF::OP1aHeader::WriteToFile(OP1aHeader *this,FileWriter *Writer,ui32_t HeaderSize)

{
  long *plVar1;
  _func_int **pp_Var2;
  int iVar3;
  ILogSink *pIVar4;
  MDDEntry *pMVar5;
  uint in_ECX;
  undefined4 in_register_00000014;
  UL *PartitionLabel;
  uint uVar6;
  undefined1 *puVar7;
  long *plVar8;
  FrameBuffer WriteWrapper;
  FrameBuffer HeaderBuffer;
  ui32_t write_count;
  Result_t result;
  FrameBuffer local_2a8;
  FrameBuffer local_280;
  undefined1 local_258 [104];
  FrameBuffer local_1f0 [2];
  undefined **local_188;
  byte_t local_180;
  byte_t local_17f [4];
  byte_t abStack_17b [19];
  Result_t local_168 [104];
  Result_t local_100 [104];
  FrameBuffer local_98 [2];
  
  PartitionLabel = (UL *)CONCAT44(in_register_00000014,HeaderSize);
  if (*(long *)(Writer + 0x78) == 0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                  ,0x3c5,
                  "virtual ASDCP::Result_t ASDCP::MXF::OP1aHeader::WriteToFile(Kumu::FileWriter &, ui32_t)"
                 );
  }
  if (*(long *)(Writer + 0x210) == 0) {
    puVar7 = Kumu::RESULT_STATE;
LAB_001a7200:
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar7);
    return this;
  }
  if (in_ECX < 0x1000) {
    pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar4,"HeaderSize %u is too small. Must be >= 4096\n",(ulong)in_ECX);
    puVar7 = Kumu::RESULT_PARAM;
    goto LAB_001a7200;
  }
  FrameBuffer::FrameBuffer(&local_280);
  iVar3 = (**(code **)(*(long *)Writer + 0x78))(Writer);
  *(ulong *)(Writer + 0xa0) = (ulong)(in_ECX - iVar3);
  FrameBuffer::Capacity((FrameBuffer *)(local_258 + 0x68),(ui32_t)&local_280);
  *(FileWriter **)(*(long *)(Writer + 0x210) + 0x50) = Writer + 0x1b0;
  plVar8 = (long *)**(long **)(Writer + 0x70);
  if (plVar8 != *(long **)(Writer + 0x70)) {
    do {
      if ((int)(ui32_t)local_1f0[0]._vptr_FrameBuffer < 0) goto LAB_001a75a3;
      plVar1 = (long *)plVar8[2];
      plVar1[10] = (long)(Writer + 0x1b0);
      FrameBuffer::FrameBuffer(&local_2a8);
      FrameBuffer::SetData(local_98,(byte_t *)&local_2a8,local_280.m_Size + (int)local_280.m_Data);
      Kumu::Result_t::~Result_t((Result_t *)local_98);
      (**(code **)(*plVar1 + 0x70))((Result_t *)local_258,plVar1,&local_2a8);
      Kumu::Result_t::operator=((Result_t *)(local_258 + 0x68),(Result_t *)local_258);
      Kumu::Result_t::~Result_t((Result_t *)local_258);
      local_280.m_Size = local_280.m_Size + local_2a8.m_Size;
      FrameBuffer::~FrameBuffer(&local_2a8);
      plVar8 = (long *)*plVar8;
    } while (plVar8 != (long *)*(long *)(Writer + 0x70));
  }
  if (-1 < (int)(ui32_t)local_1f0[0]._vptr_FrameBuffer) {
    pMVar5 = Dictionary::Type(*(Dictionary **)(Writer + 0x78),MDD_ClosedCompleteHeader);
    local_2a8.m_Data._0_1_ = 1;
    local_2a8.m_Data._1_7_ = (undefined7)*(undefined8 *)pMVar5->ul;
    local_2a8.m_Capacity._0_1_ = (undefined1)((ulong)*(undefined8 *)pMVar5->ul >> 0x38);
    local_2a8._17_7_ = SUB87(*(undefined8 *)(pMVar5->ul + 8),0);
    local_2a8.m_Size._0_1_ = (undefined1)((ulong)*(undefined8 *)(pMVar5->ul + 8) >> 0x38);
    local_2a8._vptr_FrameBuffer = (_func_int **)&PTR__IArchive_0021d318;
    Partition::WriteToFile((Partition *)local_258,Writer,PartitionLabel);
    Kumu::Result_t::operator=((Result_t *)(local_258 + 0x68),(Result_t *)local_258);
    Kumu::Result_t::~Result_t((Result_t *)local_258);
    if (-1 < (int)(ui32_t)local_1f0[0]._vptr_FrameBuffer) {
      Primer::WriteToFile((Primer *)local_258,Writer + 0x140);
      Kumu::Result_t::operator=((Result_t *)(local_258 + 0x68),(Result_t *)local_258);
      Kumu::Result_t::~Result_t((Result_t *)local_258);
      if (-1 < (int)(ui32_t)local_1f0[0]._vptr_FrameBuffer) {
        Kumu::FileWriter::Write((uchar *)local_100,HeaderSize,(uint *)local_280.m_Data);
        Kumu::Result_t::~Result_t(local_100);
        if (local_258._0_4_ != local_280.m_Size) {
          __assert_fail("write_count == HeaderBuffer.Size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                        ,0x3ef,
                        "virtual ASDCP::Result_t ASDCP::MXF::OP1aHeader::WriteToFile(Kumu::FileWriter &, ui32_t)"
                       );
        }
        if (-1 < (int)(ui32_t)local_1f0[0]._vptr_FrameBuffer) {
          (*(PartitionLabel->super_Identifier<16U>).super_IArchive._vptr_IArchive[6])
                    (local_258,PartitionLabel,&local_2a8);
          Kumu::Result_t::~Result_t((Result_t *)local_258);
          pp_Var2 = local_2a8._vptr_FrameBuffer;
          if (*(long *)(Writer + 0xa0) < (long)local_2a8._vptr_FrameBuffer) {
            pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
            snprintf(local_258,0x40,"%llu",pp_Var2);
            Kumu::ILogSink::Error
                      (pIVar4,"Header size %s exceeds specified value %u\n",local_258,(ulong)in_ECX)
            ;
            Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_FAIL);
            goto LAB_001a75b8;
          }
          FrameBuffer::FrameBuffer(&local_2a8);
          uVar6 = in_ECX - (int)pp_Var2;
          if (uVar6 < 0x14) {
            pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
            Kumu::ILogSink::Error(pIVar4,"Remaining region too small for KLV Fill header\n");
            Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_FAIL);
            FrameBuffer::~FrameBuffer(&local_2a8);
            goto LAB_001a75b8;
          }
          pMVar5 = Dictionary::Type(*(Dictionary **)(Writer + 0x78),MDD_KLVFill);
          uVar6 = uVar6 - 0x14;
          local_180 = '\x01';
          local_17f = *(byte_t (*) [4])pMVar5->ul;
          abStack_17b._0_4_ = *(undefined4 *)(pMVar5->ul + 4);
          abStack_17b[4] = pMVar5->ul[8];
          abStack_17b[5] = pMVar5->ul[9];
          abStack_17b[6] = pMVar5->ul[10];
          abStack_17b[7] = pMVar5->ul[0xb];
          abStack_17b._8_4_ = *(undefined4 *)(pMVar5->ul + 0xc);
          local_188 = &PTR__IArchive_0021d318;
          (**(code **)(*(long *)Writer + 0x60))(local_258,Writer,PartitionLabel,&local_188,uVar6);
          Kumu::Result_t::operator=((Result_t *)(local_258 + 0x68),(Result_t *)local_258);
          Kumu::Result_t::~Result_t((Result_t *)local_258);
          if (-1 < (int)(ui32_t)local_1f0[0]._vptr_FrameBuffer) {
            FrameBuffer::Capacity((FrameBuffer *)local_258,(ui32_t)&local_2a8);
            Kumu::Result_t::operator=((Result_t *)(local_258 + 0x68),(Result_t *)local_258);
            Kumu::Result_t::~Result_t((Result_t *)local_258);
            if (-1 < (int)(ui32_t)local_1f0[0]._vptr_FrameBuffer) {
              memset((void *)CONCAT71(local_2a8.m_Data._1_7_,local_2a8.m_Data._0_1_),0,(ulong)uVar6)
              ;
              Kumu::FileWriter::Write
                        ((uchar *)local_168,HeaderSize,
                         (uint *)CONCAT71(local_2a8.m_Data._1_7_,local_2a8.m_Data._0_1_));
              Kumu::Result_t::~Result_t(local_168);
              if (local_258._0_4_ != uVar6) {
                __assert_fail("write_count == klv_fill_length",
                              "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                              ,0x414,
                              "virtual ASDCP::Result_t ASDCP::MXF::OP1aHeader::WriteToFile(Kumu::FileWriter &, ui32_t)"
                             );
              }
            }
          }
          FrameBuffer::~FrameBuffer(&local_2a8);
        }
      }
    }
  }
LAB_001a75a3:
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)(local_258 + 0x68));
LAB_001a75b8:
  Kumu::Result_t::~Result_t((Result_t *)(local_258 + 0x68));
  FrameBuffer::~FrameBuffer(&local_280);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::OP1aHeader::WriteToFile(Kumu::FileWriter& Writer, ui32_t HeaderSize)
{
  assert(m_Dict);
  if ( m_Preface == 0 )
    return RESULT_STATE;

  if ( HeaderSize < 4096 ) 
    {
      DefaultLogSink().Error("HeaderSize %u is too small. Must be >= 4096\n", HeaderSize);
      return RESULT_PARAM;
    }

  ASDCP::FrameBuffer HeaderBuffer;
  HeaderByteCount = HeaderSize - ArchiveSize();
  assert (HeaderByteCount <= 0xFFFFFFFFL);
  Result_t result = HeaderBuffer.Capacity((ui32_t) HeaderByteCount); 
  m_Preface->m_Lookup = &m_Primer;

  std::list<InterchangeObject*>::iterator pl_i = m_PacketList->m_List.begin();
  for ( ; pl_i != m_PacketList->m_List.end() && ASDCP_SUCCESS(result); pl_i++ )
    {
      InterchangeObject* object = *pl_i;
      object->m_Lookup = &m_Primer;

      ASDCP::FrameBuffer WriteWrapper;
      WriteWrapper.SetData(HeaderBuffer.Data() + HeaderBuffer.Size(),
			   HeaderBuffer.Capacity() - HeaderBuffer.Size());
      result = object->WriteToBuffer(WriteWrapper);
      HeaderBuffer.Size(HeaderBuffer.Size() + WriteWrapper.Size());
    }

  if ( ASDCP_SUCCESS(result) )
    {
      UL TmpUL(m_Dict->ul(MDD_ClosedCompleteHeader));
      result = Partition::WriteToFile(Writer, TmpUL);
    }

  if ( ASDCP_SUCCESS(result) )
    result = m_Primer.WriteToFile(Writer);

  if ( ASDCP_SUCCESS(result) )
    {
      ui32_t write_count;
      Writer.Write(HeaderBuffer.RoData(), HeaderBuffer.Size(), &write_count);
      assert(write_count == HeaderBuffer.Size());
    }

  // KLV Fill
  if ( ASDCP_SUCCESS(result) )
    {
      Kumu::fpos_t pos = Writer.TellPosition();

      if ( pos > (Kumu::fpos_t)HeaderByteCount )
	{
	  char intbuf[IntBufferLen];
	  DefaultLogSink().Error("Header size %s exceeds specified value %u\n",
				 ui64sz(pos, intbuf),
				 HeaderSize);
	  return RESULT_FAIL;
	}

      ASDCP::FrameBuffer NilBuf;
      ui32_t klv_fill_length = HeaderSize - (ui32_t)pos;

      if ( klv_fill_length < kl_length )
	{
	  DefaultLogSink().Error("Remaining region too small for KLV Fill header\n");
	  return RESULT_FAIL;
	}

      klv_fill_length -= kl_length;
      result = WriteKLToFile(Writer, m_Dict->ul(MDD_KLVFill), klv_fill_length);

      if ( ASDCP_SUCCESS(result) )
	result = NilBuf.Capacity(klv_fill_length);

      if ( ASDCP_SUCCESS(result) )
	{
	  memset(NilBuf.Data(), 0, klv_fill_length);
	  ui32_t write_count;
	  Writer.Write(NilBuf.RoData(), klv_fill_length, &write_count);
	  assert(write_count == klv_fill_length);
	}
    }

  return result;
}